

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
::emplace_new_key<slang::ConstantValue&>
          (sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,ConstantValue *key)

{
  long lVar1;
  long lVar2;
  char __tmp;
  ulong uVar3;
  undefined7 in_register_00000031;
  anon_union_40_1_a8c68091_for_sherwood_v3_entry<slang::ConstantValue>_3 *__b;
  int8_t iVar4;
  sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
  sVar5;
  EntryPointer psVar6;
  EntryPointer psVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
  pVar10;
  value_type to_insert;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_58;
  
  if (*(long *)(this + 8) != 0) {
    uVar3 = CONCAT71(in_register_00000031,distance_from_desired) & 0xffffffff;
    sVar5 = SUB81(uVar3,0);
    if (this[0x11] != sVar5) {
      lVar2 = *(long *)(this + 0x18) + 1;
      auVar8._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar8._0_8_ = lVar2;
      auVar8._12_4_ = 0x45300000;
      lVar1 = *(long *)(this + 8) + 1;
      auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar9._0_8_ = lVar1;
      auVar9._12_4_ = 0x45300000;
      if ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0) <=
          (double)*(float *)(this + 0x14) *
          ((auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
        if (-1 < current_entry->distance_from_desired) {
          std::__detail::__variant::
          _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&_Stack_58,
                            (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)key);
          iVar4 = current_entry->distance_from_desired;
          current_entry->distance_from_desired = (int8_t)sVar5;
          __b = &current_entry->field_1;
          psVar6 = current_entry;
          do {
            std::swap<slang::ConstantValue>((ConstantValue *)&_Stack_58,&__b->value);
            sVar5 = (sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
                     )(iVar4 + '\x01');
            psVar7 = psVar6;
LAB_002d8d32:
            psVar6 = psVar7 + 1;
            iVar4 = psVar6->distance_from_desired;
            if (iVar4 < '\0') {
              std::__detail::__variant::
              _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&psVar7[1].field_1.value,
                                (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&_Stack_58);
              psVar6->distance_from_desired = (int8_t)sVar5;
              *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
              uVar3 = CONCAT71((uint7)((ulong)&_Stack_58 >> 8) & 0xffffff,1);
              goto LAB_002d8daf;
            }
            if ((char)sVar5 <= iVar4) goto code_r0x002d8d40;
            psVar6->distance_from_desired = (int8_t)sVar5;
            __b = &psVar7[1].field_1;
          } while( true );
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&(current_entry->field_1).value,
                          (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)key);
        current_entry->distance_from_desired = (int8_t)sVar5;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar3 = CONCAT71((int7)(uVar3 >> 8),1);
        goto LAB_002d8cd9;
      }
    }
  }
  sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
  ::grow((sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
          *)this);
  pVar10 = emplace<slang::ConstantValue&>(this,key);
  current_entry = (EntryPointer)pVar10.first.current;
  uVar3 = (ulong)pVar10._8_4_;
LAB_002d8cd9:
  pVar10._8_8_ = uVar3;
  pVar10.first.current = current_entry;
  return pVar10;
code_r0x002d8d40:
  sVar5 = (sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
           )((char)sVar5 + '\x01');
  psVar7 = psVar6;
  if (this[0x11] == sVar5) {
    std::swap<slang::ConstantValue>((ConstantValue *)&_Stack_58,&(current_entry->field_1).value);
    sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
    ::grow((sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
            *)this);
    pVar10 = sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
             ::emplace<slang::ConstantValue>
                       ((sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>
                         *)this,(ConstantValue *)&_Stack_58);
    current_entry = (EntryPointer)pVar10.first.current;
    uVar3 = (ulong)pVar10._8_4_;
LAB_002d8daf:
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&_Stack_58);
    goto LAB_002d8cd9;
  }
  goto LAB_002d8d32;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }